

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlFreeSaveCtxt(xmlSaveCtxtPtr ctxt)

{
  if (ctxt->encoding != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->encoding);
  }
  if (ctxt->buf != (xmlOutputBufferPtr)0x0) {
    xmlOutputBufferClose(ctxt->buf);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

static void
xmlFreeSaveCtxt(xmlSaveCtxtPtr ctxt)
{
    if (ctxt == NULL) return;
    if (ctxt->encoding != NULL)
        xmlFree((char *) ctxt->encoding);
    if (ctxt->buf != NULL)
        xmlOutputBufferClose(ctxt->buf);
    xmlFree(ctxt);
}